

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall flatbuffers::EnumDef::Deserialize(EnumDef *this,Parser *parser,Enum *_enum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  pointer pcVar4;
  bool bVar5;
  ushort uVar6;
  ushort uVar7;
  EnumVal *this_00;
  Enum *pEVar8;
  unsigned_short vtsize_1;
  Type *type;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  uint uVar9;
  ulong uVar10;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  long lVar11;
  unsigned_short vtsize;
  string local_70;
  string local_50;
  
  if (*(ushort *)(_enum + -(long)*(int *)_enum) < 5) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(_enum + (4 - (long)*(int *)_enum));
  }
  uVar10 = (ulong)uVar6;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,_enum + (ulong)*(uint *)(_enum + uVar10) + 4 + uVar10,
             _enum + (ulong)*(uint *)(_enum + (ulong)*(uint *)(_enum + uVar10) + 4 + uVar10 + -4) +
                     *(uint *)(_enum + uVar10) + uVar10 + 4);
  Parser::UnqualifiedName(&local_50,parser,&local_70);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar10 = 0xffffffffffffffff;
  uVar9 = 0;
  do {
    lVar11 = -(long)*(int *)_enum;
    uVar6 = *(ushort *)(_enum + -(long)*(int *)_enum);
    if (uVar6 < 7) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)(_enum + lVar11 + 6);
    }
    uVar10 = uVar10 + 1;
    uVar3 = *(uint *)(_enum + (ulong)*(uint *)(_enum + uVar7) + (ulong)uVar7);
    if (uVar3 <= uVar10) goto LAB_001357fa;
    this_00 = (EnumVal *)operator_new(0xa8);
    paVar1 = &(this_00->name).field_2;
    p_Var2 = &(this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header;
    uVar7 = 0;
    (this_00->name)._M_dataplus._M_p = (pointer)paVar1;
    (this_00->name)._M_string_length = 0;
    (this_00->name).field_2._M_local_buf[0] = '\0';
    (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this_00->doc_comment).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->doc_comment).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->doc_comment).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->union_type).base_type = BASE_TYPE_NONE;
    (this_00->union_type).element = BASE_TYPE_NONE;
    (this_00->union_type).struct_def = (StructDef *)0x0;
    (this_00->union_type).enum_def = (EnumDef *)0x0;
    (this_00->union_type).fixed_length = 0;
    (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    (this_00->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this_00->attributes).vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->attributes).vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->attributes).vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00->value = 0;
    if (6 < uVar6) {
      uVar7 = *(ushort *)(_enum + lVar11 + 6);
    }
    if (uVar7 == 0) {
      pEVar8 = (Enum *)0x0;
    }
    else {
      pEVar8 = _enum + (ulong)*(uint *)(_enum + uVar7) + (ulong)uVar7;
    }
    if (*(uint *)pEVar8 <= uVar10) {
      __assert_fail("i < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                    ,0xc1,
                    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::EnumVal>, SizeT = unsigned int]"
                   );
    }
    bVar5 = EnumVal::Deserialize
                      (this_00,parser,
                       (EnumVal *)
                       (pEVar8 + (ulong)*(uint *)(pEVar8 + (ulong)uVar9 + 4) + (ulong)uVar9 + 4));
    if (!bVar5) break;
    uVar9 = uVar9 + 4;
    bVar5 = SymbolTable<flatbuffers::EnumVal>::Add(&this->vals,(string *)this_00,this_00);
  } while (!bVar5);
  SymbolTable<flatbuffers::Value>::~SymbolTable(&this_00->attributes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this_00->doc_comment);
  pcVar4 = (this_00->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this_00,0xa8);
  if (uVar3 <= uVar10) {
LAB_001357fa:
    lVar11 = -(long)*(int *)_enum;
    uVar6 = *(ushort *)(_enum + -(long)*(int *)_enum);
    if (uVar6 < 9) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)(_enum + lVar11 + 8);
    }
    if (uVar7 == 0) {
      bVar5 = false;
    }
    else {
      bVar5 = _enum[uVar7].super_Table != (Table)0x0;
    }
    this->is_union = bVar5;
    if (uVar6 < 0xb) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)(_enum + lVar11 + 10);
    }
    if (uVar6 == 0) {
      type = (Type *)0x0;
    }
    else {
      type = (Type *)(_enum + (ulong)*(uint *)(_enum + uVar6) + (ulong)uVar6);
    }
    bVar5 = Type::Deserialize(&this->underlying_type,parser,type);
    if (bVar5) {
      if (*(ushort *)(_enum + -(long)*(int *)_enum) < 0xd) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ushort *)(_enum + (0xc - (long)*(int *)_enum));
      }
      if (uVar6 == 0) {
        attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
      }
      else {
        attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
                (_enum + (ulong)*(uint *)(_enum + uVar6) + (ulong)uVar6);
      }
      bVar5 = DeserializeAttributesCommon(&(this->super_Definition).attributes,parser,attrs);
      if (bVar5) {
        if (*(ushort *)(_enum + -(long)*(int *)_enum) < 0xf) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(ushort *)(_enum + (0xe - (long)*(int *)_enum));
        }
        if (uVar6 == 0) {
          documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
        }
        else {
          documentation =
               (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
               (_enum + (ulong)*(uint *)(_enum + uVar6) + (ulong)uVar6);
        }
        anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool EnumDef::Deserialize(Parser &parser, const reflection::Enum *_enum) {
  name = parser.UnqualifiedName(_enum->name()->str());
  for (uoffset_t i = 0; i < _enum->values()->size(); ++i) {
    auto val = new EnumVal();
    if (!val->Deserialize(parser, _enum->values()->Get(i)) ||
        vals.Add(val->name, val)) {
      delete val;
      return false;
    }
  }
  is_union = _enum->is_union();
  if (!underlying_type.Deserialize(parser, _enum->underlying_type())) {
    return false;
  }
  if (!DeserializeAttributes(parser, _enum->attributes())) return false;
  DeserializeDoc(doc_comment, _enum->documentation());
  return true;
}